

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>>>
               (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
                *lhs,Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>
                     *rhs,
               Transpose<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *dest,Scalar *alpha)

{
  Index *this;
  long lVar1;
  ScalarWithConstIfNotLvalue *res;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
  *this_00;
  float *ptr;
  size_t size;
  Index rows;
  TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
  *pTVar2;
  Index cols;
  ulong uVar3;
  Scalar *pSVar4;
  Index IVar5;
  Index resIncr;
  undefined1 *puVar6;
  Scalar SVar7;
  Scalar SVar8;
  float alpha_00;
  undefined1 auStack_2b8 [8];
  ScalarWithConstIfNotLvalue *local_2b0;
  Index local_2a8;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
  *local_2a0;
  float *local_298;
  size_t local_290;
  Index local_288;
  TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
  *local_280;
  Index local_278;
  Scalar *local_270;
  float *local_268;
  Scalar *local_260;
  Scalar *local_258;
  float local_250;
  float local_24c;
  BlockImpl_dense<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>,__1,_1,_true,_true>
  local_248;
  const_blas_data_mapper<float,_long,_0> local_1f8 [2];
  const_blas_data_mapper<float,_long,_1> local_1d8;
  undefined1 local_1c8 [8];
  aligned_stack_memory_handler<float> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  undefined1 local_1a0 [3];
  gemv_static_vector_if<float,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_> *dest_local
  ;
  Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>
  *rhs_local;
  Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
  *lhs_local;
  
  puVar6 = auStack_2b8;
  blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>_>
  ::extract((ExtractType *)
            &actualRhs.m_matrix.m_matrix.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
             .m_outerStride,lhs);
  blas_traits<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
  ::extract((ExtractType *)local_1a0,rhs);
  local_250 = *alpha;
  SVar7 = blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>_>
          ::extractScalarFactor(lhs);
  local_24c = local_250 * SVar7;
  SVar8 = blas_traits<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
          ::extractScalarFactor(rhs);
  alpha_00 = local_24c * SVar8;
  uVar3 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
          ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
                  *)local_1a0);
  if (0x3fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  pSVar4 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Dense>
                   *)local_1a0);
  if (pSVar4 == (Scalar *)0x0) {
    IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
            ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
                    *)local_1a0);
    if ((ulong)(IVar5 * 4) < 0x20001) {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
                      *)local_1a0);
      lVar1 = -(IVar5 * 4 + 0x1eU & 0xfffffffffffffff0);
      puVar6 = auStack_2b8 + lVar1;
      local_260 = (Scalar *)((long)&local_2b0 + lVar1);
    }
    else {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
                      *)local_1a0);
      local_260 = (Scalar *)aligned_malloc(IVar5 << 2);
    }
    local_258 = local_260;
  }
  else {
    local_258 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Dense>
                ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Dense>
                        *)local_1a0);
    puVar6 = auStack_2b8;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_258;
  *(undefined8 *)(puVar6 + -8) = 0x295e3d;
  pSVar4 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Dense>
                   *)local_1a0);
  if (pSVar4 == (Scalar *)0x0) {
    local_268 = (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_268 = (float *)0x0;
  }
  local_298 = local_268;
  local_2a0 = (EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
               *)local_1a0;
  *(undefined8 *)(puVar6 + -8) = 0x295e7f;
  local_290 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>_>
                      *)local_1a0);
  this_00 = local_2a0;
  *(undefined8 *)(puVar6 + -8) = 0x295e92;
  IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
          ::size(this_00);
  size = local_290;
  ptr = local_298;
  *(undefined8 *)(puVar6 + -8) = 0x295ebc;
  aligned_stack_memory_handler<float>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_1c8,ptr,size,0x20000 < (ulong)(IVar5 << 2)
            );
  this = &actualRhs.m_matrix.m_matrix.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
          .m_outerStride;
  local_280 = (TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
               *)this;
  *(undefined8 *)(puVar6 + -8) = 0x295ecf;
  local_288 = Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::rows((Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
                      *)this);
  pTVar2 = local_280;
  *(undefined8 *)(puVar6 + -8) = 0x295ee2;
  local_278 = Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::cols((Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
                      *)pTVar2);
  pTVar2 = local_280;
  *(undefined8 *)(puVar6 + -8) = 0x295ef5;
  local_270 = TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Dense>
              ::data(pTVar2);
  *(undefined8 *)(puVar6 + -8) = 0x295f0a;
  local_2a8 = TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Dense>
              ::outerStride((TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
                             *)&actualRhs.m_matrix.m_matrix.
                                super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
                                .m_outerStride);
  local_1d8.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data = local_270;
  local_1f8[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
       (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_1f8[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
  local_1d8.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride = local_2a8;
  *(undefined8 *)(puVar6 + -8) = 0x29602c;
  local_2b0 = TransposeImpl<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Dense>
              ::data((TransposeImpl<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Dense>
                      *)dest);
  *(undefined8 *)(puVar6 + -8) = 0x29604c;
  DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>
  ::col((ColXpr *)&local_248,
        (DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
         *)dest,0);
  *(undefined8 *)(puVar6 + -8) = 0x29605a;
  resIncr = BlockImpl_dense<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_-1,_1,_true,_true>
            ::innerStride(&local_248);
  cols = local_278;
  rows = local_288;
  res = local_2b0;
  *(undefined8 *)(puVar6 + -8) = 0x29608d;
  general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
  ::run(rows,cols,&local_1d8,local_1f8,res,resIncr,alpha_00);
  *(undefined8 *)(puVar6 + -8) = 0x29609b;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_1c8);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }